

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common_aggregate_optimizer.cpp
# Opt level: O2

unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> __thiscall
duckdb::CommonAggregateOptimizer::VisitReplace
          (CommonAggregateOptimizer *this,BoundColumnRefExpression *expr,
          unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *expr_ptr)

{
  _Head_base<0UL,_duckdb::Expression_*,_false> _Var1;
  iterator iVar2;
  
  iVar2 = ::std::
          _Hashtable<duckdb::ColumnBinding,_std::pair<const_duckdb::ColumnBinding,_duckdb::ColumnBinding>,_std::allocator<std::pair<const_duckdb::ColumnBinding,_duckdb::ColumnBinding>_>,_std::__detail::_Select1st,_duckdb::ColumnBindingEquality,_duckdb::ColumnBindingHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find((_Hashtable<duckdb::ColumnBinding,_std::pair<const_duckdb::ColumnBinding,_duckdb::ColumnBinding>,_std::allocator<std::pair<const_duckdb::ColumnBinding,_duckdb::ColumnBinding>_>,_std::__detail::_Select1st,_duckdb::ColumnBindingEquality,_duckdb::ColumnBindingHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  *)&(expr->super_Expression).super_BaseExpression.type,(key_type *)(expr_ptr + 0xb)
                );
  if (iVar2.
      super__Node_iterator_base<std::pair<const_duckdb::ColumnBinding,_duckdb::ColumnBinding>,_true>
      ._M_cur != (__node_type *)0x0) {
    _Var1._M_head_impl =
         *(Expression **)
          ((long)iVar2.
                 super__Node_iterator_base<std::pair<const_duckdb::ColumnBinding,_duckdb::ColumnBinding>,_true>
                 ._M_cur + 0x20);
    ((key_type *)(expr_ptr + 0xb))->table_index =
         *(idx_t *)((long)iVar2.
                          super__Node_iterator_base<std::pair<const_duckdb::ColumnBinding,_duckdb::ColumnBinding>,_true>
                          ._M_cur + 0x18);
    expr_ptr[0xc].super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
    _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
    super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = _Var1._M_head_impl;
  }
  (this->super_LogicalOperatorVisitor)._vptr_LogicalOperatorVisitor = (_func_int **)0x0;
  return (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
         (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)this;
}

Assistant:

unique_ptr<Expression> CommonAggregateOptimizer::VisitReplace(BoundColumnRefExpression &expr,
                                                              unique_ptr<Expression> *expr_ptr) {
	// check if this column ref points to an aggregate that was remapped; if it does we remap it
	auto entry = aggregate_map.find(expr.binding);
	if (entry != aggregate_map.end()) {
		expr.binding = entry->second;
	}
	return nullptr;
}